

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O1

void msd_D_adaptive<vector_brodnik<unsigned_char*>>
               (uchar **strings,size_t n,size_t depth,vector_brodnik<unsigned_char_*> *buckets)

{
  vector_brodnik<unsigned_char_*> *pvVar1;
  uchar *puVar2;
  uchar **ppuVar3;
  pointer pppuVar4;
  size_t j;
  long *__ptr;
  long lVar5;
  ulong uVar6;
  uint8_t *puVar7;
  ushort uVar8;
  long lVar9;
  size_t __n;
  size_t j_1;
  long lVar10;
  long lVar11;
  byte bVar12;
  uchar **ppuVar13;
  ulong uVar14;
  size_t sVar15;
  long lVar16;
  uint16_t cache [16];
  ushort auStack_58 [20];
  
  if (n < 0x10000) {
    msd_D<vector_brodnik<unsigned_char*>,unsigned_short>(strings,n,depth,buckets);
    return;
  }
  __ptr = (long *)malloc(0x80000);
  if ((n & 0xfffffffffffffff0) == 0) {
    sVar15 = 0;
  }
  else {
    sVar15 = 0;
    ppuVar13 = strings;
    do {
      lVar5 = 0;
      do {
        puVar2 = ppuVar13[lVar5];
        if (puVar2 == (uchar *)0x0) goto LAB_00198d81;
        if (puVar2[depth] == '\0') {
          uVar8 = 0;
        }
        else {
          uVar8 = CONCAT11(puVar2[depth],puVar2[depth + 1]);
        }
        auStack_58[lVar5] = uVar8;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x10);
      lVar5 = 0;
      do {
        pvVar1 = buckets + auStack_58[lVar5];
        if (buckets[auStack_58[lVar5]]._left_in_block == 0) {
          vector_brodnik<unsigned_char_*>::grow(pvVar1);
        }
        puVar2 = ppuVar13[lVar5];
        ppuVar3 = pvVar1->_insertpos;
        pvVar1->_insertpos = ppuVar3 + 1;
        *ppuVar3 = puVar2;
        pvVar1->_left_in_block = pvVar1->_left_in_block - 1;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x10);
      sVar15 = sVar15 + 0x10;
      ppuVar13 = ppuVar13 + 0x10;
    } while (sVar15 < (n & 0xfffffffffffffff0));
  }
  if (sVar15 < n) {
    do {
      puVar2 = strings[sVar15];
      if (puVar2 == (uchar *)0x0) {
LAB_00198d81:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar2[depth] == '\0') {
        uVar6 = 0;
      }
      else {
        uVar6 = (ulong)CONCAT11(puVar2[depth],puVar2[depth + 1]);
      }
      pvVar1 = buckets + uVar6;
      if (buckets[uVar6]._left_in_block == 0) {
        vector_brodnik<unsigned_char_*>::grow(pvVar1);
      }
      puVar2 = strings[sVar15];
      ppuVar13 = pvVar1->_insertpos;
      pvVar1->_insertpos = ppuVar13 + 1;
      *ppuVar13 = puVar2;
      pvVar1->_left_in_block = pvVar1->_left_in_block - 1;
      sVar15 = sVar15 + 1;
    } while (n != sVar15);
  }
  puVar7 = &buckets->_superblock;
  lVar5 = 0;
  do {
    __ptr[lVar5] = ((long)(2 << (*puVar7 & 0x1f)) -
                   ((ulong)*(ushort *)(puVar7 + -4) * *(size_t *)(puVar7 + -0xc) +
                   *(size_t *)(puVar7 + -0x14))) + -0x40;
    lVar5 = lVar5 + 1;
    puVar7 = puVar7 + 0x38;
  } while (lVar5 != 0x10000);
  lVar5 = 0;
  lVar9 = 0;
  do {
    if (__ptr[lVar5] != 0) {
      pvVar1 = buckets + lVar5;
      ppuVar13 = strings + lVar9;
      if (buckets[lVar5]._index_block.
          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          buckets[lVar5]._index_block.
          super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar16 = 8;
        uVar6 = 0;
        lVar10 = 8;
        bVar12 = 0;
        do {
          if (lVar10 != 0) {
            lVar11 = lVar10;
            uVar14 = uVar6;
            do {
              pppuVar4 = (pvVar1->_index_block).
                         super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              if (uVar14 == ((long)(pvVar1->_index_block).
                                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pppuVar4 >> 3)
                            - 1U) goto LAB_00198ccd;
              if (lVar16 != 0) {
                memmove(ppuVar13,pppuVar4[uVar14],lVar16 * 8);
              }
              uVar14 = uVar14 + 1;
              ppuVar13 = ppuVar13 + lVar16;
              lVar11 = lVar11 + -1;
            } while (lVar11 != 0);
          }
          uVar6 = uVar6 + lVar10;
          lVar10 = lVar10 << bVar12;
          bVar12 = bVar12 ^ 1;
          lVar16 = lVar16 << bVar12;
        } while (uVar6 < (ulong)((long)(pvVar1->_index_block).
                                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(pvVar1->_index_block).
                                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
LAB_00198ccd:
      ppuVar3 = (pvVar1->_index_block).
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_finish[-1];
      __n = (long)pvVar1->_insertpos - (long)ppuVar3;
      if (__n != 0) {
        memmove(ppuVar13,ppuVar3,__n);
      }
      lVar9 = lVar9 + __ptr[lVar5];
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 0x10000) {
      lVar5 = 0;
      do {
        vector_brodnik<unsigned_char_*>::clear
                  ((vector_brodnik<unsigned_char_*> *)
                   ((long)&(buckets->_index_block).
                           super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar5));
        lVar5 = lVar5 + 0x38;
      } while (lVar5 != 0x380000);
      lVar5 = *__ptr;
      lVar9 = 1;
      do {
        sVar15 = __ptr[lVar9];
        if (sVar15 != 0) {
          if ((char)lVar9 != '\0') {
            msd_D_adaptive<vector_brodnik<unsigned_char*>>(strings + lVar5,sVar15,depth + 2,buckets)
            ;
          }
          lVar5 = lVar5 + sVar15;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x10000);
      free(__ptr);
      return;
    }
  } while( true );
}

Assistant:

static void
msd_D_adaptive(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 0x10000) {
		msd_D<Bucket, uint16_t>(strings, n, depth, buckets);
		return;
	}
	size_t* bucketsize = (size_t*) malloc(0x10000 * sizeof(size_t));
	size_t i=0;
	for (; i < n-n%16; i+=16) {
		uint16_t cache[16];
		for (size_t j=0; j < 16; ++j) {
			cache[j] = get_char<uint16_t>(strings[i+j], depth);
		}
		for (size_t j=0; j < 16; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		const uint16_t ch = get_char<uint16_t>(strings[i], depth);
		buckets[ch].push_back(strings[i]);
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_D_adaptive(
				strings+pos, bucketsize[i],
				depth+2, buckets);
		pos += bucketsize[i];
	}
	free(bucketsize);
}